

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscCore.c
# Opt level: O0

void Ssc_ManStop(Ssc_Man_t *p)

{
  Ssc_Man_t *p_local;
  
  Vec_IntFreeP(&p->vFront);
  Vec_IntFreeP(&p->vFanins);
  Vec_IntFreeP(&p->vPattern);
  Vec_IntFreeP(&p->vDisPairs);
  Vec_IntFreeP(&p->vPivot);
  Vec_IntFreeP(&p->vId2Var);
  Vec_IntFreeP(&p->vVar2Id);
  if (p->pSat != (sat_solver *)0x0) {
    sat_solver_delete(p->pSat);
  }
  Gia_ManStopP(&p->pFraig);
  if (p != (Ssc_Man_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Ssc_ManStop( Ssc_Man_t * p )
{
    Vec_IntFreeP( &p->vFront );
    Vec_IntFreeP( &p->vFanins );
    Vec_IntFreeP( &p->vPattern );
    Vec_IntFreeP( &p->vDisPairs );
    Vec_IntFreeP( &p->vPivot );
    Vec_IntFreeP( &p->vId2Var );
    Vec_IntFreeP( &p->vVar2Id );
    if ( p->pSat ) sat_solver_delete( p->pSat );
    Gia_ManStopP( &p->pFraig );
    ABC_FREE( p );
}